

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

Collision * __thiscall
Scene::findNearestCollision
          (Collision *__return_storage_ptr__,Scene *this,Vector3 *start,Vector3 *dir)

{
  pointer ppLVar1;
  pointer ppOVar2;
  long lVar3;
  pointer ppLVar4;
  undefined8 *puVar5;
  Collision *pCVar6;
  pointer ppOVar7;
  byte bVar8;
  Collision coll;
  undefined8 local_b0 [14];
  double local_40;
  
  bVar8 = 0;
  Collision::Collision(__return_storage_ptr__);
  ppLVar4 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppLVar1 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppLVar4 != ppLVar1) {
    do {
      (*(*ppLVar4)->_vptr_Light[3])(local_b0,*ppLVar4,start,dir);
      if ((local_40 < 1000000000.0) && (local_40 + 1e-06 < __return_storage_ptr__->dist)) {
        puVar5 = local_b0;
        pCVar6 = __return_storage_ptr__;
        for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
          pCVar6->object = (Object *)*puVar5;
          puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
          pCVar6 = (Collision *)((long)pCVar6 + (ulong)bVar8 * -0x10 + 8);
        }
      }
      ppLVar4 = ppLVar4 + 1;
    } while (ppLVar4 != ppLVar1);
  }
  ppOVar7 = (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar2 = (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar7 != ppOVar2) {
    do {
      (*(*ppOVar7)->_vptr_Object[2])(local_b0,*ppOVar7,start,dir);
      if ((local_40 < 1000000000.0) && (local_40 + 1e-06 < __return_storage_ptr__->dist)) {
        puVar5 = local_b0;
        pCVar6 = __return_storage_ptr__;
        for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
          pCVar6->object = (Object *)*puVar5;
          puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
          pCVar6 = (Collision *)((long)pCVar6 + (ulong)bVar8 * -0x10 + 8);
        }
      }
      ppOVar7 = ppOVar7 + 1;
    } while (ppOVar7 != ppOVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

Collision Scene::findNearestCollision(const Vector3& start, const Vector3& dir) const
{
    Collision ret;
    for (auto l : m_lights)
    {
        Collision coll = l->collide(start, dir);
        if (coll.isHit() && coll.dist + Const::EPS < ret.dist) ret = coll;
    }
    for (auto o : m_objects)
    {
        Collision coll = o->collide(start, dir);
        if (coll.isHit() && coll.dist + Const::EPS < ret.dist) ret = coll;
    }
    return ret;
}